

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

Result_Type chaiscript::boxed_cast<int>(Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Result_Type RVar2;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *p_Var3;
  const_iterator cVar4;
  bad_boxed_cast *this;
  undefined1 local_48 [32];
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_48._0_8_ = &int::typeinfo;
    local_48._8_8_ = &int::typeinfo;
    local_48._16_4_ = 0x10;
    bVar1 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_48);
    if (!bVar1) {
      p_Var3 = &Type_Conversions::thread_cache((t_conversions->m_conversions)._M_data)->_M_t;
      local_48._24_8_ = &int::typeinfo;
      cVar4 = std::
              _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
              ::find(p_Var3,(key_type *)(local_48 + 0x18));
      if ((_Rb_tree_header *)cVar4._M_node != &(p_Var3->_M_impl).super__Rb_tree_header) {
        if (t_conversions != (Type_Conversions_State *)0x0) {
          p_Var3 = &Type_Conversions::thread_cache((t_conversions->m_conversions)._M_data)->_M_t;
          local_48._0_8_ = &int::typeinfo;
          cVar4 = std::
                  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
                  ::find(p_Var3,(key_type *)local_48);
          if ((_Rb_tree_header *)cVar4._M_node != &(p_Var3->_M_impl).super__Rb_tree_header) {
            Type_Conversions::boxed_type_conversion<int>
                      ((Type_Conversions *)local_48,
                       (Conversion_Saves *)(t_conversions->m_conversions)._M_data,
                       (Boxed_Value *)(t_conversions->m_saves)._M_data);
            RVar2 = detail::Cast_Helper_Inner<int>::cast((Boxed_Value *)local_48,t_conversions);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              return RVar2;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
            return RVar2;
          }
        }
        this = (bad_boxed_cast *)__cxa_allocate_exception(0x48);
        exception::bad_boxed_cast::bad_boxed_cast
                  (this,((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(type_info *)&int::typeinfo);
        __cxa_throw(this,&exception::bad_boxed_cast::typeinfo,
                    exception::bad_boxed_cast::~bad_boxed_cast);
      }
    }
  }
  RVar2 = detail::Cast_Helper_Inner<int>::cast(bv,t_conversions);
  return RVar2;
}

Assistant:

typename detail::Cast_Helper<Type>::Result_Type boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr)
  {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }


    if (t_conversions && (*t_conversions)->convertable_type<Type>())
    {
      try {
        // std::cout << "trying an up conversion " << typeid(Type).name() << '\n';
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions);
      } catch (...) {
        try {
        //  std::cout << "trying a down conversion " << typeid(Type).name() << '\n';
          // try going the other way - down the inheritance graph
          return detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv), t_conversions);
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not polymorphic, just throw the error, don't waste the time on the 
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }

  }